

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

bool spvOpcodeIsAbort(Op opcode)

{
  if ((((0x21 < opcode - OpTerminateInvocation) ||
       ((0x300000001U >> ((ulong)(opcode - OpTerminateInvocation) & 0x3f) & 1) == 0)) &&
      (opcode != OpKill)) && ((opcode != OpUnreachable && (opcode != OpEmitMeshTasksEXT)))) {
    return false;
  }
  return true;
}

Assistant:

bool spvOpcodeIsAbort(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpKill:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      return true;
    default:
      return false;
  }
}